

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int geopolyOverlap(GeoPoly *p1,GeoPoly *p2)

{
  double dVar1;
  double dVar2;
  int iVar3;
  GeoOverlap *p;
  GeoEvent *pRight;
  GeoEvent *pGVar4;
  GeoSegment *pGVar5;
  GeoSegment *pGVar6;
  GeoSegment *pGVar7;
  GeoSegment *pGVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  double dVar14;
  undefined4 local_1cc;
  GeoSegment *local_1c8;
  long local_1c0 [49];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar9 = (long)(p1->nVertex + p2->nVertex + 2);
  local_1cc = 0xaaaaaaaa;
  iVar3 = sqlite3_initialize();
  if (iVar3 == 0) {
    p = (GeoOverlap *)sqlite3Malloc(lVar9 * 0x70 + 0x18);
  }
  else {
    p = (GeoOverlap *)0x0;
  }
  if (p == (GeoOverlap *)0x0) {
    iVar3 = -1;
  }
  else {
    p->aEvent = (GeoEvent *)(p + 1);
    p->aSegment = (GeoSegment *)((long)p + lVar9 * 0x40 + 0x18);
    p->nEvent = 0;
    p->nSegment = 0;
    geopolyAddSegments(p,p1,'\x01');
    geopolyAddSegments(p,p2,'\x02');
    pGVar4 = p->aEvent;
    iVar3 = p->nEvent;
    memset(&local_1c8,0xaa,400);
    if ((long)iVar3 < 1) {
      uVar11 = 0;
    }
    else {
      lVar9 = 0;
      uVar12 = 0;
      do {
        pRight = pGVar4 + lVar9;
        pGVar4[lVar9].pNext = (GeoEvent *)0x0;
        bVar13 = 0 < (int)uVar12;
        if ((int)uVar12 < 1) {
LAB_001fe94f:
          uVar11 = 0;
        }
        else {
          if (local_1c8 == (GeoSegment *)0x0) {
            bVar13 = true;
            goto LAB_001fe94f;
          }
          uVar11 = 0;
          pGVar5 = local_1c8;
          do {
            pRight = geopolyEventMerge((GeoEvent *)pGVar5,pRight);
            local_1c0[uVar11 - 1] = 0;
            if (uVar12 - 1 == uVar11) {
              bVar13 = false;
              uVar11 = uVar12;
              goto LAB_001fe959;
            }
            pGVar5 = (GeoSegment *)local_1c0[uVar11];
            uVar11 = uVar11 + 1;
          } while (pGVar5 != (GeoSegment *)0x0);
          bVar13 = uVar11 < uVar12;
        }
LAB_001fe959:
        local_1c0[(uVar11 & 0xffffffff) - 1] = (long)pRight;
        uVar11 = (ulong)((int)uVar11 + 1);
        if (bVar13) {
          uVar11 = uVar12;
        }
        lVar9 = lVar9 + 1;
        uVar12 = uVar11;
      } while (lVar9 != iVar3);
    }
    if ((int)uVar11 < 1) {
      pGVar4 = (GeoEvent *)0x0;
    }
    else {
      uVar12 = 0;
      pGVar4 = (GeoEvent *)0x0;
      do {
        pGVar4 = geopolyEventMerge((GeoEvent *)local_1c0[uVar12 - 1],pGVar4);
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
    if (pGVar4 == (GeoEvent *)0x0) {
      dVar14 = 0.0;
    }
    else {
      dVar14 = (double)(-(ulong)(pGVar4->x == 0.0) & 0xbff0000000000000);
    }
    local_1cc = 0;
    if (pGVar4 != (GeoEvent *)0x0) {
      pGVar5 = (GeoSegment *)0x0;
      bVar13 = false;
      iVar3 = 0;
      do {
        dVar1 = pGVar4->x;
        if ((dVar1 != dVar14) || (NAN(dVar1) || NAN(dVar14))) {
          if (bVar13) {
            memset(&local_1c8,0xaa,400);
            uVar11 = 0;
            while (uVar12 = uVar11, iVar10 = (int)uVar12, pGVar5 != (GeoSegment *)0x0) {
              pGVar6 = pGVar5->pNext;
              pGVar5->pNext = (GeoSegment *)0x0;
              bVar13 = 0 < iVar10;
              if (iVar10 < 1) {
LAB_001fea79:
                uVar11 = 0;
              }
              else {
                if (local_1c8 == (GeoSegment *)0x0) {
                  bVar13 = true;
                  goto LAB_001fea79;
                }
                uVar11 = 0;
                pGVar8 = local_1c8;
                do {
                  pGVar5 = geopolySegmentMerge(pGVar8,pGVar5);
                  local_1c0[uVar11 - 1] = 0;
                  if (uVar12 - 1 == uVar11) {
                    bVar13 = false;
                    uVar11 = uVar12;
                    goto LAB_001fea83;
                  }
                  pGVar8 = (GeoSegment *)local_1c0[uVar11];
                  uVar11 = uVar11 + 1;
                } while (pGVar8 != (GeoSegment *)0x0);
                bVar13 = uVar11 < uVar12;
              }
LAB_001fea83:
              local_1c0[(uVar11 & 0xffffffff) - 1] = (long)pGVar5;
              pGVar5 = pGVar6;
              uVar11 = (ulong)((int)uVar11 + 1);
              if (bVar13) {
                uVar11 = uVar12;
              }
            }
            if (iVar10 < 1) {
              pGVar5 = (GeoSegment *)0x0;
            }
            else {
              uVar11 = 0;
              pGVar5 = (GeoSegment *)0x0;
              do {
                pGVar5 = geopolySegmentMerge((GeoSegment *)local_1c0[uVar11 - 1],pGVar5);
                uVar11 = uVar11 + 1;
              } while (uVar12 != uVar11);
            }
          }
          uVar11 = 0;
          if (pGVar5 != (GeoSegment *)0x0) {
            uVar11 = 0;
            pGVar6 = pGVar5;
            pGVar8 = (GeoSegment *)0x0;
            do {
              pGVar7 = pGVar6;
              if (pGVar8 != (GeoSegment *)0x0) {
                if ((pGVar8->y != pGVar7->y) || (NAN(pGVar8->y) || NAN(pGVar7->y))) {
                  *(undefined1 *)((long)&local_1cc + uVar11) = 1;
                }
              }
              uVar11 = (ulong)((uint)uVar11 ^ (uint)pGVar7->side);
              pGVar6 = pGVar7->pNext;
              pGVar8 = pGVar7;
            } while (pGVar7->pNext != (GeoSegment *)0x0);
          }
          iVar10 = 0;
          if (pGVar5 != (GeoSegment *)0x0) {
            pGVar8 = (GeoSegment *)0x0;
            pGVar6 = pGVar5;
            do {
              dVar14 = pGVar6->C * dVar1 + pGVar6->B;
              pGVar6->y = dVar14;
              if (pGVar8 == (GeoSegment *)0x0) {
LAB_001feb4e:
                uVar11 = (ulong)((uint)uVar11 ^ (uint)pGVar6->side);
                iVar10 = 0;
                bVar13 = true;
                pGVar8 = pGVar6;
              }
              else {
                dVar2 = pGVar8->y;
                if ((dVar2 <= dVar14) || (pGVar8->side == pGVar6->side)) {
                  if ((dVar2 != dVar14) || (NAN(dVar2) || NAN(dVar14))) {
                    *(undefined1 *)((long)&local_1cc + uVar11) = 1;
                  }
                  goto LAB_001feb4e;
                }
                iVar10 = 10;
                iVar3 = 1;
                bVar13 = false;
              }
            } while ((bVar13) && (pGVar6 = pGVar6->pNext, iVar10 = 0, pGVar6 != (GeoSegment *)0x0));
          }
          if (iVar10 != 0) {
            if (iVar10 != 10) goto LAB_001fec51;
            goto LAB_001fec47;
          }
          bVar13 = false;
          dVar14 = dVar1;
        }
        pGVar6 = pGVar4->pSeg;
        if (pGVar4->eType == 0) {
          pGVar6->y = (double)pGVar6->y0;
          pGVar6->pNext = pGVar5;
          bVar13 = true;
          pGVar5 = pGVar6;
        }
        else {
          pGVar8 = pGVar5;
          if (pGVar5 == pGVar6) {
            if (pGVar5 == (GeoSegment *)0x0) {
              pGVar5 = (GeoSegment *)0x0;
            }
            else {
              pGVar5 = pGVar5->pNext;
            }
          }
          else {
            do {
              pGVar7 = pGVar8;
              if (pGVar7 == (GeoSegment *)0x0) goto LAB_001febea;
              pGVar8 = pGVar7->pNext;
            } while (pGVar8 != pGVar6);
            if (pGVar8 == (GeoSegment *)0x0) {
              pGVar6 = (GeoSegment *)0x0;
            }
            else {
              pGVar6 = pGVar8->pNext;
            }
            pGVar7->pNext = pGVar6;
          }
        }
LAB_001febea:
        pGVar4 = pGVar4->pNext;
      } while (pGVar4 != (GeoEvent *)0x0);
    }
    if (local_1cc._3_1_ == '\0') {
      iVar3 = 0;
    }
    else {
      iVar3 = 3;
      if ((local_1cc._1_1_ == '\0' || local_1cc._2_1_ != '\0') &&
         (iVar3 = 2, local_1cc._1_1_ != '\0' || local_1cc._2_1_ == '\0')) {
        iVar3 = (uint)(local_1cc._1_1_ == '\0' && local_1cc._2_1_ == '\0') * 3 + 1;
      }
    }
LAB_001fec47:
    sqlite3_free(p);
  }
LAB_001fec51:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int geopolyOverlap(GeoPoly *p1, GeoPoly *p2){
  sqlite3_int64 nVertex = p1->nVertex + p2->nVertex + 2;
  GeoOverlap *p;
  sqlite3_int64 nByte;
  GeoEvent *pThisEvent;
  double rX;
  int rc = 0;
  int needSort = 0;
  GeoSegment *pActive = 0;
  GeoSegment *pSeg;
  unsigned char aOverlap[4];

  nByte = sizeof(GeoEvent)*nVertex*2
           + sizeof(GeoSegment)*nVertex
           + sizeof(GeoOverlap);
  p = sqlite3_malloc64( nByte );
  if( p==0 ) return -1;
  p->aEvent = (GeoEvent*)&p[1];
  p->aSegment = (GeoSegment*)&p->aEvent[nVertex*2];
  p->nEvent = p->nSegment = 0;
  geopolyAddSegments(p, p1, 1);
  geopolyAddSegments(p, p2, 2);
  pThisEvent = geopolySortEventsByX(p->aEvent, p->nEvent);
  rX = pThisEvent && pThisEvent->x==0.0 ? -1.0 : 0.0;
  memset(aOverlap, 0, sizeof(aOverlap));
  while( pThisEvent ){
    if( pThisEvent->x!=rX ){
      GeoSegment *pPrev = 0;
      int iMask = 0;
      GEODEBUG(("Distinct X: %g\n", pThisEvent->x));
      rX = pThisEvent->x;
      if( needSort ){
        GEODEBUG(("SORT\n"));
        pActive = geopolySortSegmentsByYAndC(pActive);
        needSort = 0;
      }
      for(pSeg=pActive; pSeg; pSeg=pSeg->pNext){
        if( pPrev ){
          if( pPrev->y!=pSeg->y ){
            GEODEBUG(("MASK: %d\n", iMask));
            aOverlap[iMask] = 1;
          }
        }
        iMask ^= pSeg->side;
        pPrev = pSeg;
      }
      pPrev = 0;
      for(pSeg=pActive; pSeg; pSeg=pSeg->pNext){
        double y = pSeg->C*rX + pSeg->B;
        GEODEBUG(("Segment %d.%d %g->%g\n", pSeg->side, pSeg->idx, pSeg->y, y));
        pSeg->y = y;
        if( pPrev ){
          if( pPrev->y>pSeg->y && pPrev->side!=pSeg->side ){
            rc = 1;
            GEODEBUG(("Crossing: %d.%d and %d.%d\n",
                    pPrev->side, pPrev->idx,
                    pSeg->side, pSeg->idx));
            goto geopolyOverlapDone;
          }else if( pPrev->y!=pSeg->y ){
            GEODEBUG(("MASK: %d\n", iMask));
            aOverlap[iMask] = 1;
          }
        }
        iMask ^= pSeg->side;
        pPrev = pSeg;
      }
    }
    GEODEBUG(("%s %d.%d C=%g B=%g\n",
      pThisEvent->eType ? "RM " : "ADD",
      pThisEvent->pSeg->side, pThisEvent->pSeg->idx,
      pThisEvent->pSeg->C,
      pThisEvent->pSeg->B));
    if( pThisEvent->eType==0 ){
      /* Add a segment */
      pSeg = pThisEvent->pSeg;
      pSeg->y = pSeg->y0;
      pSeg->pNext = pActive;
      pActive = pSeg;
      needSort = 1;
    }else{
      /* Remove a segment */
      if( pActive==pThisEvent->pSeg ){
        pActive = ALWAYS(pActive) ? pActive->pNext : 0;
      }else{
        for(pSeg=pActive; pSeg; pSeg=pSeg->pNext){
          if( pSeg->pNext==pThisEvent->pSeg ){
            pSeg->pNext = ALWAYS(pSeg->pNext) ? pSeg->pNext->pNext : 0;
            break;
          }
        }
      }
    }
    pThisEvent = pThisEvent->pNext;
  }
  if( aOverlap[3]==0 ){
    rc = 0;
  }else if( aOverlap[1]!=0 && aOverlap[2]==0 ){
    rc = 3;
  }else if( aOverlap[1]==0 && aOverlap[2]!=0 ){
    rc = 2;
  }else if( aOverlap[1]==0 && aOverlap[2]==0 ){
    rc = 4;
  }else{
    rc = 1;
  }

geopolyOverlapDone:
  sqlite3_free(p);
  return rc;
}